

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticVersion.cpp
# Opt level: O3

bool __thiscall beast::SemanticVersion::parse(SemanticVersion *this,string *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  ulong uVar3;
  SemanticVersion *pSVar4;
  bool bVar5;
  int iVar6;
  locale *plVar7;
  ctype *pcVar8;
  long lVar9;
  byte *pbVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte *pbVar13;
  string version;
  string local_80;
  string local_60;
  string *local_40;
  SemanticVersion *local_38;
  
  pbVar11 = (byte *)(input->_M_dataplus)._M_p;
  uVar3 = input->_M_string_length;
  pbVar12 = pbVar11;
  local_40 = input;
  local_38 = this;
  if (0 < (long)uVar3 >> 2) {
    pbVar12 = pbVar11 + (uVar3 & 0xfffffffffffffffc);
    lVar9 = ((long)uVar3 >> 2) + 1;
    pbVar13 = pbVar11 + 3;
    do {
      bVar2 = pbVar13[-3];
      plVar7 = (locale *)std::locale::classic();
      pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
      if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 1 + (ulong)bVar2 * 2) & 0x20) == 0) {
        pbVar13 = pbVar13 + -3;
        goto LAB_001bec75;
      }
      bVar2 = pbVar13[-2];
      plVar7 = (locale *)std::locale::classic();
      pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
      if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 1 + (ulong)bVar2 * 2) & 0x20) == 0) {
        pbVar13 = pbVar13 + -2;
        goto LAB_001bec75;
      }
      bVar2 = pbVar13[-1];
      plVar7 = (locale *)std::locale::classic();
      pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
      if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 1 + (ulong)bVar2 * 2) & 0x20) == 0) {
        pbVar13 = pbVar13 + -1;
        goto LAB_001bec75;
      }
      bVar2 = *pbVar13;
      plVar7 = (locale *)std::locale::classic();
      pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
      if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 1 + (ulong)bVar2 * 2) & 0x20) == 0)
      goto LAB_001bec75;
      lVar9 = lVar9 + -1;
      pbVar13 = pbVar13 + 4;
    } while (1 < lVar9);
  }
  pbVar11 = pbVar11 + uVar3;
  lVar9 = (long)pbVar11 - (long)pbVar12;
  if (lVar9 == 1) {
LAB_001bec53:
    bVar2 = *pbVar12;
    plVar7 = (locale *)std::locale::classic();
    pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
    pbVar13 = pbVar11;
    if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 1 + (ulong)bVar2 * 2) & 0x20) == 0) {
      pbVar13 = pbVar12;
    }
  }
  else if (lVar9 == 2) {
LAB_001bec1d:
    bVar2 = *pbVar12;
    plVar7 = (locale *)std::locale::classic();
    pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
    pbVar13 = pbVar12;
    if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 1 + (ulong)bVar2 * 2) & 0x20) != 0) {
      pbVar12 = pbVar12 + 1;
      goto LAB_001bec53;
    }
  }
  else {
    pbVar13 = pbVar11;
    if (lVar9 == 3) {
      bVar2 = *pbVar12;
      plVar7 = (locale *)std::locale::classic();
      pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
      pbVar13 = pbVar12;
      if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 1 + (ulong)bVar2 * 2) & 0x20) != 0) {
        pbVar12 = pbVar12 + 1;
        goto LAB_001bec1d;
      }
    }
  }
LAB_001bec75:
  pbVar12 = (byte *)(local_40->_M_dataplus)._M_p;
  pbVar11 = pbVar12 + local_40->_M_string_length;
  lVar9 = (long)local_40->_M_string_length >> 2;
  pbVar10 = pbVar11;
  if (0 < lVar9) {
    pbVar10 = pbVar11 + lVar9 * -4;
    lVar9 = lVar9 + 1;
    do {
      bVar2 = pbVar11[-1];
      plVar7 = (locale *)std::locale::classic();
      pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
      if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 1 + (ulong)bVar2 * 2) & 0x20) == 0)
      goto LAB_001bedd3;
      bVar2 = pbVar11[-2];
      plVar7 = (locale *)std::locale::classic();
      pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
      if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 1 + (ulong)bVar2 * 2) & 0x20) == 0) {
        pbVar11 = pbVar11 + -1;
        goto LAB_001bedd3;
      }
      bVar2 = pbVar11[-3];
      plVar7 = (locale *)std::locale::classic();
      pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
      if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 1 + (ulong)bVar2 * 2) & 0x20) == 0) {
        pbVar11 = pbVar11 + -2;
        goto LAB_001bedd3;
      }
      bVar2 = pbVar11[-4];
      plVar7 = (locale *)std::locale::classic();
      pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
      if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 1 + (ulong)bVar2 * 2) & 0x20) == 0) {
        pbVar11 = pbVar11 + -3;
        goto LAB_001bedd3;
      }
      pbVar11 = pbVar11 + -4;
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  lVar9 = (long)pbVar10 - (long)pbVar12;
  if (lVar9 == 1) {
LAB_001bed9d:
    bVar2 = pbVar10[-1];
    plVar7 = (locale *)std::locale::classic();
    pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
    pbVar11 = pbVar10;
    if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 1 + (ulong)bVar2 * 2) & 0x20) != 0) {
      pbVar11 = pbVar12;
    }
  }
  else if (lVar9 == 2) {
LAB_001bed7c:
    bVar2 = pbVar10[-1];
    plVar7 = (locale *)std::locale::classic();
    pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
    pbVar11 = pbVar10;
    if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 1 + (ulong)bVar2 * 2) & 0x20) != 0) {
      pbVar10 = pbVar10 + -1;
      goto LAB_001bed9d;
    }
  }
  else {
    pbVar11 = pbVar12;
    if (lVar9 == 3) {
      bVar2 = pbVar10[-1];
      plVar7 = (locale *)std::locale::classic();
      pcVar8 = std::use_facet<std::ctype<char>>(plVar7);
      pbVar11 = pbVar10;
      if ((*(byte *)(*(long *)(pcVar8 + 0x30) + 1 + (ulong)bVar2 * 2) & 0x20) != 0) {
        pbVar10 = pbVar10 + -1;
        goto LAB_001bed7c;
      }
    }
  }
LAB_001bedd3:
  if (pbVar11 <= pbVar13) {
    return false;
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_60,pbVar13,pbVar11);
  if ((local_60._M_string_length == local_40->_M_string_length) &&
     ((local_60._M_string_length == 0 ||
      (iVar6 = bcmp(local_60._M_dataplus._M_p,(local_40->_M_dataplus)._M_p,local_60._M_string_length
                   ), iVar6 == 0)))) {
    pSVar4 = local_38;
    bVar5 = chopUInt(&local_38->majorVersion,0x7fffffff,&local_60);
    if (bVar5) {
      paVar1 = &local_80.field_2;
      local_80._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,".","");
      bVar5 = chop(&local_80,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((bVar5) && (bVar5 = chopUInt(&pSVar4->minorVersion,0x7fffffff,&local_60), bVar5)) {
        local_80._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,".","");
        bVar5 = chop(&local_80,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((bVar5) && (bVar5 = chopUInt(&pSVar4->patchVersion,0x7fffffff,&local_60), bVar5)) {
          local_80._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"-","");
          bVar5 = chop(&local_80,&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar1) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if ((!bVar5) ||
             ((bVar5 = extract_identifiers(&pSVar4->preReleaseIdentifiers,false,&local_60), bVar5 &&
              ((pSVar4->preReleaseIdentifiers).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (pSVar4->preReleaseIdentifiers).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)))) {
            local_80._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"+","");
            bVar5 = chop(&local_80,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar1) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            if ((!bVar5) ||
               ((bVar5 = extract_identifiers(&pSVar4->metaData,true,&local_60), bVar5 &&
                ((pSVar4->metaData).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 (pSVar4->metaData).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)))) {
              bVar5 = local_60._M_string_length == 0;
              goto LAB_001bf017;
            }
            goto LAB_001bee1e;
          }
        }
      }
    }
    bVar5 = false;
  }
  else {
LAB_001bee1e:
    bVar5 = false;
  }
LAB_001bf017:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool SemanticVersion::parse (std::string const& input)
{
    // May not have leading or trailing whitespace
    auto left_iter = std::find_if_not (input.begin (), input.end (),
        [](std::string::value_type c)
        {
            return std::isspace (c, std::locale::classic());
        });

    auto right_iter = std::find_if_not (input.rbegin (), input.rend (),
        [](std::string::value_type c)
        {
            return std::isspace (c, std::locale::classic());
        }).base ();

    // Must not be empty!
    if (left_iter >= right_iter)
        return false;

    std::string version (left_iter, right_iter);

    // May not have leading or trailing whitespace
    if (version != input)
        return false;

    // Must have major version number
    if (! chopUInt (majorVersion, std::numeric_limits <int>::max (), version))
        return false;
    if (! chop (".", version))
        return false;

    // Must have minor version number
    if (! chopUInt (minorVersion, std::numeric_limits <int>::max (), version))
        return false;
    if (! chop (".", version))
        return false;

    // Must have patch version number
    if (! chopUInt (patchVersion, std::numeric_limits <int>::max (), version))
        return false;

    // May have pre-release identifier list
    if (chop ("-", version))
    {
        if (!extract_identifiers (preReleaseIdentifiers, false, version))
            return false;

        // Must not be empty
        if (preReleaseIdentifiers.empty ())
            return false;
    }

    // May have metadata identifier list
    if (chop ("+", version))
    {
        if (!extract_identifiers (metaData, true, version))
            return false;

        // Must not be empty
        if (metaData.empty ())
            return false;
    }

    return version.empty ();
}